

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void slang::function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
     callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__2>
               (intptr_t callable,DiagCode params,unsigned_long params_1,unsigned_long params_2,
               optional<char> params_3)

{
  Diagnostic *this;
  SourceRange sourceRange;
  
  sourceRange.startLoc =
       (SourceLocation)(params_1 * 0x10000000 + *(long *)**(undefined8 **)(callable + 8));
  sourceRange.endLoc = (SourceLocation)(params_2 * 0x10000000 + (long)sourceRange.startLoc);
  this = ast::ASTContext::addDiag(*(ASTContext **)callable,params,sourceRange);
  if (((ushort)params_3.super__Optional_base<char,_true,_true>._M_payload.
               super__Optional_payload_base<char> & 0x100) == 0) {
    return;
  }
  Diagnostic::operator<<
            (this,params_3.super__Optional_base<char,_true,_true>._M_payload.
                  super__Optional_payload_base<char>._M_payload);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }